

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLatch.c
# Opt level: O2

char * Abc_NtkCollectLatchValuesStr(Abc_Ntk_t *pNtk)

{
  int iVar1;
  char *pcVar2;
  Abc_Obj_t *pLatch;
  char cVar3;
  long lVar4;
  
  pcVar2 = (char *)malloc((long)pNtk->nObjCounts[8] + 1);
  lVar4 = 0;
  do {
    if (pNtk->vBoxes->nSize <= lVar4) {
      pcVar2[lVar4] = '\0';
      return pcVar2;
    }
    pLatch = Abc_NtkBox(pNtk,(int)lVar4);
    if ((*(uint *)&pLatch->field_0x14 & 0xf) == 8) {
      if ((pLatch->field_5).pData == (void *)0x1) {
        cVar3 = '0';
      }
      else {
        iVar1 = Abc_LatchIsInit1(pLatch);
        cVar3 = '1';
        if (iVar1 == 0) {
          iVar1 = Abc_LatchIsInitDc(pLatch);
          cVar3 = 'x';
          if (iVar1 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcLatch.c"
                          ,0xe3,"char *Abc_NtkCollectLatchValuesStr(Abc_Ntk_t *)");
          }
        }
      }
      pcVar2[lVar4] = cVar3;
    }
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

char * Abc_NtkCollectLatchValuesStr( Abc_Ntk_t * pNtk )
{
    char * pInits;
    Abc_Obj_t * pLatch;
    int i;
    pInits = ABC_ALLOC( char, Abc_NtkLatchNum(pNtk) + 1 );
    Abc_NtkForEachLatch( pNtk, pLatch, i )
    {
        if ( Abc_LatchIsInit0(pLatch) )
            pInits[i] = '0';
        else if ( Abc_LatchIsInit1(pLatch) )
            pInits[i] = '1';
        else if ( Abc_LatchIsInitDc(pLatch) )
            pInits[i] = 'x';
        else
            assert( 0 );
    }
    pInits[i] = 0;
    return pInits;
}